

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::StringTree::
concat<kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,StringTree *params,
          ArrayPtr<const_char> *params_1,ArrayPtr<const_char> *params_2,
          ArrayPtr<const_char> *params_3,ArrayPtr<const_char> *params_4,
          ArrayPtr<const_char> *params_5,ArrayPtr<const_char> *params_6,
          ArrayPtr<const_char> *params_7,ArrayPtr<const_char> *params_8,
          ArrayPtr<const_char> *params_9)

{
  size_t sVar1;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  char *pos;
  initializer_list<unsigned_long> nums;
  initializer_list<unsigned_long> nums_00;
  initializer_list<unsigned_long> nums_01;
  Array<kj::StringTree::Branch> local_b8;
  StringTree *local_a0;
  StringTree *local_98;
  ArrayPtr<const_char> *local_90;
  ArrayPtr<const_char> *local_88;
  size_t local_80;
  char *local_78;
  size_t sStack_70;
  size_t local_68;
  size_t sStack_60;
  size_t local_58;
  size_t sStack_50;
  size_t local_48;
  size_t sStack_40;
  size_t local_38;
  
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->text).content.size_ = 0;
  local_80 = this->size_;
  local_78 = (params->text).content.ptr;
  sStack_70 = params_1->size_;
  local_68 = params_2->size_;
  sStack_60 = params_3->size_;
  local_58 = params_4->size_;
  sStack_50 = params_5->size_;
  local_48 = params_6->size_;
  sStack_40 = params_7->size_;
  local_38 = params_8->size_;
  nums._M_len = (size_type)params_7;
  nums._M_array = (iterator)0xa;
  local_a0 = this;
  sVar1 = _::sum((_ *)&local_80,nums);
  local_80 = 0;
  __return_storage_ptr__->size_ = sVar1;
  local_78 = (params->text).content.ptr;
  sStack_70 = params_1->size_;
  local_68 = params_2->size_;
  sStack_60 = params_3->size_;
  local_58 = params_4->size_;
  sStack_50 = params_5->size_;
  local_48 = params_6->size_;
  sStack_40 = params_7->size_;
  local_38 = params_8->size_;
  nums_00._M_len = extraout_RDX;
  nums_00._M_array = (iterator)0xa;
  local_98 = params;
  local_90 = params_1;
  local_88 = params_2;
  sVar1 = _::sum((_ *)&local_80,nums_00);
  heapString((String *)&local_b8,sVar1);
  Array<char>::operator=(&(__return_storage_ptr__->text).content,(Array<char> *)&local_b8);
  Array<char>::~Array((Array<char> *)&local_b8);
  local_80 = 1;
  local_78 = (char *)0x0;
  sStack_70 = 0;
  local_68 = 0;
  sStack_60 = 0;
  local_58 = 0;
  sStack_50 = 0;
  local_48 = 0;
  sStack_40 = 0;
  local_38 = 0;
  nums_01._M_len = extraout_RDX_00;
  nums_01._M_array = (iterator)0xa;
  sVar1 = _::sum((_ *)&local_80,nums_01);
  local_b8.ptr = _::HeapArrayDisposer::allocate<kj::StringTree::Branch>(sVar1);
  local_b8.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_b8.size_ = sVar1;
  Array<kj::StringTree::Branch>::operator=(&__return_storage_ptr__->branches,&local_b8);
  Array<kj::StringTree::Branch>::~Array(&local_b8);
  pos = (char *)(__return_storage_ptr__->text).content.size_;
  if (pos != (char *)0x0) {
    pos = (__return_storage_ptr__->text).content.ptr;
  }
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pos,0,local_a0,(ArrayPtr<const_char> *)local_98,local_90,
             local_88,params_3,params_4,params_5,params_6,params_7,params_8);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}